

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O1

void sFillRHS(trans_t trans,int nrhs,float *x,int ldx,SuperMatrix *A,SuperMatrix *B)

{
  char transc [1];
  
  sp_sgemm(transc,"N",A->nrow,nrhs,A->ncol,1.0,A,x,ldx,0.0,*(float **)((long)B->Store + 8),*B->Store
          );
  return;
}

Assistant:

void
sFillRHS(trans_t trans, int nrhs, float *x, int ldx,
         SuperMatrix *A, SuperMatrix *B)
{
    DNformat *Bstore;
    float   *rhs;
    float one = 1.0;
    float zero = 0.0;
    int      ldc;
    char transc[1];

    //Astore = A->Store;
    //Aval   = (float *) Astore->nzval;
    Bstore = B->Store;
    rhs    = Bstore->nzval;
    ldc    = Bstore->lda;
    
    if ( trans == NOTRANS ) *(unsigned char *)transc = 'N';
    else *(unsigned char *)transc = 'T';

    sp_sgemm(transc, "N", A->nrow, nrhs, A->ncol, one, A,
	     x, ldx, zero, rhs, ldc);

}